

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::RenderingTwoBoundingCellsProducesSpan(RendererTests *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int cover_1;
  int iVar4;
  int cover;
  uint uVar5;
  int cover_2;
  span reference2 [2];
  scanline_mockup sl2;
  span reference1 [1];
  scanline_mockup sl1;
  allocator local_f9;
  string local_f8;
  LocationInfo local_d8;
  string local_b0;
  scanline_mockup local_90;
  span local_68;
  scanline_mockup local_58;
  
  local_58.excepted_y = -1000000;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._inprogress = true;
  local_90.excepted_y = -1000000;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._current_y = 0x7fffffff;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90._inprogress = true;
  local_90._current_y = 0x7fffffff;
  lVar3 = 0;
  uVar5 = 0;
  do {
    iVar4 = *(int *)((long)&DAT_001a84d0 + lVar3);
    iVar2 = 0;
    do {
      lVar1 = lVar3;
      lVar3 = lVar1 + 0xc;
      iVar2 = iVar2 + *(int *)((long)&DAT_001a84d4 + lVar1);
      uVar5 = uVar5 + *(int *)((long)&DAT_001a84d8 + lVar1);
      if (lVar3 == 0x18) break;
    } while (*(int *)((long)&DAT_001a84dc + lVar1) == iVar4);
    if (iVar2 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&local_58,iVar4,uVar5 * 0x200 - iVar2);
      iVar4 = iVar4 + 1;
    }
    if (lVar3 == 0x18) {
      local_68.y = 0x7fffffff;
      local_68.x = 8;
      local_68.length = 5;
      local_68.cover = 0x2200;
      std::__cxx11::string::string
                ((string *)&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,(allocator *)&local_b0);
      ut::LocationInfo::LocationInfo(&local_d8,&local_f8,0xc2);
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                ((span (*) [1])&local_68,&local_58.spans_log,&local_d8);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      lVar3 = 0;
      uVar5 = 0;
      do {
        iVar4 = *(int *)((long)&DAT_001a84f0 + lVar3);
        iVar2 = 0;
        do {
          lVar1 = lVar3;
          lVar3 = lVar1 + 0xc;
          iVar2 = iVar2 + *(int *)((long)&DAT_001a84f4 + lVar1);
          uVar5 = uVar5 + *(int *)((long)&DAT_001a84f8 + lVar1);
          if (lVar3 == 0x18) break;
        } while (*(int *)((long)&DAT_001a84fc + lVar1) == iVar4);
        if (iVar2 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_90,iVar4,uVar5 * 0x200 - iVar2);
          iVar4 = iVar4 + 1;
        }
        if (lVar3 == 0x18) {
          lVar3 = 0;
          uVar5 = 0;
          do {
            iVar4 = *(int *)((long)&DAT_001a8510 + lVar3);
            iVar2 = 0;
            do {
              lVar1 = lVar3;
              lVar3 = lVar1 + 0xc;
              iVar2 = iVar2 + *(int *)((long)&DAT_001a8514 + lVar1);
              uVar5 = uVar5 + *(int *)((long)&DAT_001a8518 + lVar1);
              if (lVar3 == 0x18) break;
            } while (*(int *)((long)&DAT_001a851c + lVar1) == iVar4);
            if (iVar2 != 0) {
              anon_unknown_1::scanline_mockup::add_cell(&local_90,iVar4,uVar5 * 0x200 - iVar2);
              iVar4 = iVar4 + 1;
            }
            if (lVar3 == 0x18) {
              local_f8.field_2._M_allocated_capacity = 0x13d62b7fffffff;
              local_f8.field_2._8_8_ = 0xffff3800000007cf;
              local_f8._M_dataplus._M_p = (pointer)0xb7fffffff;
              local_f8._M_string_length = 0x1fe00000000bc;
              std::__cxx11::string::string
                        ((string *)&local_b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                         ,&local_f9);
              ut::LocationInfo::LocationInfo(&local_d8,&local_b0,0xce);
              ut::
              are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                        ((span (*) [2])&local_f8,&local_90.spans_log,&local_d8);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              anon_unknown_1::scanline_mockup::~scanline_mockup(&local_90);
              anon_unknown_1::scanline_mockup::~scanline_mockup(&local_58);
              return;
            }
            iVar2 = *(int *)((long)&DAT_001a851c + lVar1) - iVar4;
            if ((iVar2 != 0) && ((uVar5 & 0x7fffff) != 0)) {
              anon_unknown_1::scanline_mockup::add_span(&local_90,iVar4,iVar2,uVar5 * 0x200);
            }
          } while( true );
        }
        iVar2 = *(int *)((long)&DAT_001a84fc + lVar1) - iVar4;
        if ((iVar2 != 0) && ((uVar5 & 0x7fffff) != 0)) {
          anon_unknown_1::scanline_mockup::add_span(&local_90,iVar4,iVar2,uVar5 * 0x200);
        }
      } while( true );
    }
    iVar2 = *(int *)((long)&DAT_001a84dc + lVar1) - iVar4;
    if ((iVar2 != 0) && ((uVar5 & 0x7fffff) != 0)) {
      anon_unknown_1::scanline_mockup::add_span(&local_58,iVar4,iVar2,uVar5 * 0x200);
    }
  } while( true );
}

Assistant:

test( RenderingTwoBoundingCellsProducesSpan )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 8, 0, 17 }, { 13, 0, -17 }, };
				mocks::cell cells2[] = { { 11, 0, 255 }, { 199, 0, -255 }, };
				mocks::cell cells3[] = { { 1300011, 0, -100 }, { 1302010, 0, 100 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = {
					{ 0x7fffffff, 8, 5, 17 * 512 },
				};

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());
				sweep_scanline<8>(sl2, begin(cells3), end(cells3), bypass_alpha());

				// ASSERT
				span reference2[] = {
					{ 0x7fffffff, 11, 188, 255 * 512 },
					{ 0x7fffffff, 1300011, 1999, -100 * 512 },
				};

				assert_equal(reference2, sl2.spans_log);
			}